

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::ReflectionOpsTest_MergeExtensions_Test::TestBody
          (ReflectionOpsTest_MergeExtensions_Test *this)

{
  ConstType CVar1;
  ConstType value;
  allocator<char> local_89;
  TestAllExtensions message;
  TestAllExtensions message2;
  string local_28;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions(&message);
  proto2_unittest::TestAllExtensions::TestAllExtensions(&message2);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>(&message);
  CVar1 = proto2_unittest::TestAllExtensions::
          GetExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false,_0>
                    (&message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                               *)&proto2_unittest::optional_int32_extension);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,(unsigned_char)5,false>
            (&message2,
             (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
              *)&proto2_unittest::optional_int32_extension,CVar1);
  proto2_unittest::TestAllExtensions::
  ClearExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,(unsigned_char)5,false>
            (&message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                       *)&proto2_unittest::optional_int32_extension);
  value = proto2_unittest::TestAllExtensions::
          GetExtension<google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false,_0>
                    (&message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                               *)proto2_unittest::optional_string_extension);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false>
            (&message2,
             (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
              *)proto2_unittest::optional_string_extension,value);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"something else",&local_89)
  ;
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false>
            (&message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                       *)proto2_unittest::optional_string_extension,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  CVar1 = proto2_unittest::TestAllExtensions::
          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false,_0>
                    (&message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                               *)&proto2_unittest::repeated_int32_extension,1);
  proto2_unittest::TestAllExtensions::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)5,false>
            (&message2,
             (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
              *)&proto2_unittest::repeated_int32_extension,CVar1);
  CVar1 = proto2_unittest::TestAllExtensions::
          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false,_0>
                    (&message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                               *)&proto2_unittest::repeated_int32_extension,0);
  proto2_unittest::TestAllExtensions::
  ClearExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)5,false>
            (&message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                       *)&proto2_unittest::repeated_int32_extension);
  proto2_unittest::TestAllExtensions::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)5,false>
            (&message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                       *)&proto2_unittest::repeated_int32_extension,CVar1);
  ReflectionOps::Merge(&message2.super_Message,&message.super_Message);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>(&message);
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&message2);
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&message);
  return;
}

Assistant:

TEST(ReflectionOpsTest, MergeExtensions) {
  // Note:  Copy is implemented in terms of Merge() so technically the Copy
  //   test already tested most of this.

  unittest::TestAllExtensions message, message2;

  TestUtil::SetAllExtensions(&message);

  // This field will test merging into an empty spot.
  message2.SetExtension(
      unittest::optional_int32_extension,
      message.GetExtension(unittest::optional_int32_extension));
  message.ClearExtension(unittest::optional_int32_extension);

  // This tests overwriting.
  message2.SetExtension(
      unittest::optional_string_extension,
      message.GetExtension(unittest::optional_string_extension));
  message.SetExtension(unittest::optional_string_extension, "something else");

  // This tests concatenating.
  message2.AddExtension(
      unittest::repeated_int32_extension,
      message.GetExtension(unittest::repeated_int32_extension, 1));
  int32_t i = message.GetExtension(unittest::repeated_int32_extension, 0);
  message.ClearExtension(unittest::repeated_int32_extension);
  message.AddExtension(unittest::repeated_int32_extension, i);

  ReflectionOps::Merge(message2, &message);

  TestUtil::ExpectAllExtensionsSet(message);
}